

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  char cVar9;
  U32 UVar10;
  long *plVar11;
  size_t sVar12;
  long *plVar13;
  long *plVar14;
  ulong uVar15;
  byte bVar16;
  U32 UVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  BYTE *litEnd;
  long *plVar22;
  BYTE *pBVar23;
  seqDef *psVar24;
  long *plVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  long *plVar37;
  long *plVar38;
  long *plVar39;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  ulong local_98;
  BYTE *litLimit_w;
  BYTE *litLimit_w_6;
  long *local_78;
  ulong local_70;
  ulong local_60;
  
  uVar28 = (ms->cParams).minMatch;
  uVar18 = (ms->cParams).targetLength;
  pUVar6 = ms->hashTable;
  cVar9 = (char)(ms->cParams).hashLog;
  local_78 = (long *)src;
  if (uVar18 < 2) {
    pBVar7 = (ms->window).base;
    pBVar2 = (BYTE *)((long)src + srcSize);
    iVar20 = (int)pBVar7;
    iVar35 = (int)pBVar2 - iVar20;
    uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar18 = (ms->window).dictLimit;
    uVar27 = iVar35 - uVar32;
    if (iVar35 - uVar18 <= uVar32) {
      uVar27 = uVar18;
    }
    if (ms->loadedDictEnd != 0) {
      uVar27 = uVar18;
    }
    pBVar3 = pBVar7 + uVar27;
    plVar22 = (long *)((ulong)(pBVar3 == (BYTE *)src) + (long)src);
    iVar35 = (int)plVar22 - iVar20;
    uVar31 = iVar35 - uVar32;
    if (iVar35 - uVar18 <= uVar32) {
      uVar31 = uVar18;
    }
    plVar11 = (long *)((long)src + (srcSize - 8));
    uVar32 = *rep;
    if (ms->loadedDictEnd != 0) {
      uVar31 = uVar18;
    }
    uVar18 = rep[1];
    uVar31 = iVar35 - uVar31;
    uVar26 = uVar18;
    if (uVar31 < uVar18) {
      uVar26 = 0;
    }
    uVar30 = (ulong)uVar26;
    uVar26 = 0;
    if (uVar32 <= uVar31) {
      uVar26 = uVar32;
    }
    local_b8 = (ulong)uVar26;
    if (uVar28 == 5) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        uVar28 = (uint)local_b8;
        local_b0._0_4_ = (uint)uVar30;
        if (plVar11 <= (long *)((long)plVar22 + 3U)) break;
        plVar38 = plVar22 + 0x10;
        uVar36 = (ulong)(*plVar22 * -0x30e4432345000000) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar26 = pUVar6[uVar36];
        lVar33 = -local_b8;
        plVar14 = (long *)((long)plVar22 + 1);
        plVar13 = (long *)((long)plVar22 + 2);
        uVar30 = 2;
        plVar25 = (long *)((long)plVar22 + 3U);
        while( true ) {
          plVar37 = plVar13;
          uVar29 = (ulong)(lVar19 * -0x30e4432345000000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar20;
          iVar35 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar36] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar35)) {
            uVar30 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar30);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar30));
            uVar30 = uVar30 | 4;
            pUVar6[uVar29] = (int)plVar14 - iVar20;
            UVar10 = 1;
            uVar28 = (uint)local_b0;
            local_70 = local_b8;
            goto LAB_01bf814a;
          }
          if ((uVar27 <= uVar26) &&
             (uVar34 = (ulong)uVar26, (int)*plVar22 == *(int *)(pBVar7 + uVar34)))
          goto LAB_01bf8104;
          uVar26 = pUVar6[uVar29];
          uVar34 = (ulong)uVar26;
          uVar36 = (ulong)(*plVar37 * -0x30e4432345000000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar14 - iVar20;
          pUVar6[uVar29] = uVar21;
          if ((uVar27 <= uVar26) && ((int)*plVar14 == *(int *)(pBVar7 + uVar34))) break;
          uVar26 = pUVar6[uVar36];
          uVar29 = uVar30;
          if (plVar38 <= (long *)((long)plVar37 + uVar30)) {
            plVar38 = plVar38 + 0x10;
            uVar29 = uVar30 + 1;
          }
          lVar19 = *plVar25;
          plVar39 = (long *)(uVar30 + (long)plVar25);
          plVar14 = plVar25;
          plVar13 = (long *)((long)plVar37 + uVar30);
          plVar22 = plVar37;
          uVar30 = uVar29;
          plVar25 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf8c58;
        }
        plVar22 = plVar14;
        plVar14 = plVar37;
        uVar29 = uVar36;
        if (uVar30 < 5) {
LAB_01bf8104:
          pUVar6[uVar29] = (int)plVar14 - iVar20;
        }
        pBVar23 = pBVar7 + uVar34;
        uVar26 = (int)plVar22 - (int)pBVar23;
        local_70 = (ulong)uVar26;
        UVar10 = uVar26 + 3;
        uVar30 = 4;
        for (; ((pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar30 = uVar30 + 1;
        }
LAB_01bf814a:
        sVar12 = ZSTD_count((BYTE *)(uVar30 + (long)plVar22),pBVar23 + uVar30,pBVar2);
        uVar36 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf818b:
          seqStore->lit = seqStore->lit + uVar36;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar36) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar36) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar36);
            }
            goto LAB_01bf818b;
          }
          seqStore->lit = pBVar23 + uVar36;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar36;
        psVar24->offBase = UVar10;
        uVar36 = (sVar12 + uVar30) - 3;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar36;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar30);
        uVar30 = (ulong)uVar28;
        local_78 = plVar22;
        local_b8 = local_70;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e4432345000000) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar20;
          uVar30 = 0;
          if (uVar28 != 0) {
            for (; (plVar22 <= plVar11 && ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)uVar28))
                   ); plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)uVar28)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar20;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              uVar30 = (ulong)uVar28;
              uVar28 = (uint)local_b8;
              local_b8 = uVar30;
            }
            uVar30 = (ulong)uVar28;
            local_78 = plVar22;
          }
        }
      }
    }
    else if (uVar28 == 6) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        uVar28 = (uint)local_b8;
        local_b0._0_4_ = (uint)uVar30;
        if (plVar11 <= (long *)((long)plVar22 + 3U)) break;
        plVar38 = plVar22 + 0x10;
        uVar36 = (ulong)(*plVar22 * -0x30e4432340650000) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar26 = pUVar6[uVar36];
        lVar33 = -local_b8;
        plVar14 = (long *)((long)plVar22 + 1);
        plVar13 = (long *)((long)plVar22 + 2);
        uVar30 = 2;
        plVar25 = (long *)((long)plVar22 + 3U);
        while( true ) {
          plVar37 = plVar13;
          uVar29 = (ulong)(lVar19 * -0x30e4432340650000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar20;
          iVar35 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar36] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar35)) {
            uVar30 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar30);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar30));
            uVar30 = uVar30 | 4;
            pUVar6[uVar29] = (int)plVar14 - iVar20;
            UVar10 = 1;
            uVar28 = (uint)local_b0;
            local_70 = local_b8;
            goto LAB_01bf78bc;
          }
          if ((uVar27 <= uVar26) &&
             (uVar34 = (ulong)uVar26, (int)*plVar22 == *(int *)(pBVar7 + uVar34)))
          goto LAB_01bf7876;
          uVar26 = pUVar6[uVar29];
          uVar34 = (ulong)uVar26;
          uVar36 = (ulong)(*plVar37 * -0x30e4432340650000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar14 - iVar20;
          pUVar6[uVar29] = uVar21;
          if ((uVar27 <= uVar26) && ((int)*plVar14 == *(int *)(pBVar7 + uVar34))) break;
          uVar26 = pUVar6[uVar36];
          uVar29 = uVar30;
          if (plVar38 <= (long *)((long)plVar37 + uVar30)) {
            plVar38 = plVar38 + 0x10;
            uVar29 = uVar30 + 1;
          }
          lVar19 = *plVar25;
          plVar39 = (long *)(uVar30 + (long)plVar25);
          plVar14 = plVar25;
          plVar13 = (long *)((long)plVar37 + uVar30);
          plVar22 = plVar37;
          uVar30 = uVar29;
          plVar25 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf8c58;
        }
        plVar22 = plVar14;
        plVar14 = plVar37;
        uVar29 = uVar36;
        if (uVar30 < 5) {
LAB_01bf7876:
          pUVar6[uVar29] = (int)plVar14 - iVar20;
        }
        pBVar23 = pBVar7 + uVar34;
        uVar26 = (int)plVar22 - (int)pBVar23;
        local_70 = (ulong)uVar26;
        UVar10 = uVar26 + 3;
        uVar30 = 4;
        for (; ((pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar30 = uVar30 + 1;
        }
LAB_01bf78bc:
        sVar12 = ZSTD_count((BYTE *)(uVar30 + (long)plVar22),pBVar23 + uVar30,pBVar2);
        uVar36 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf78fd:
          seqStore->lit = seqStore->lit + uVar36;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar36) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar36) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar36);
            }
            goto LAB_01bf78fd;
          }
          seqStore->lit = pBVar23 + uVar36;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar36;
        psVar24->offBase = UVar10;
        uVar36 = (sVar12 + uVar30) - 3;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar36;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar30);
        uVar30 = (ulong)uVar28;
        local_78 = plVar22;
        local_b8 = local_70;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e4432340650000) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar20;
          uVar30 = 0;
          if (uVar28 != 0) {
            for (; (plVar22 <= plVar11 && ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)uVar28))
                   ); plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)uVar28)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar20;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              uVar30 = (ulong)uVar28;
              uVar28 = (uint)local_b8;
              local_b8 = uVar30;
            }
            uVar30 = (ulong)uVar28;
            local_78 = plVar22;
          }
        }
      }
    }
    else if (uVar28 == 7) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        uVar28 = (uint)local_b8;
        local_b0._0_4_ = (uint)uVar30;
        if (plVar11 <= (long *)((long)plVar22 + 3U)) break;
        plVar38 = plVar22 + 0x10;
        uVar29 = (ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar26 = pUVar6[uVar29];
        lVar33 = -local_b8;
        plVar14 = (long *)((long)plVar22 + 1);
        plVar13 = (long *)((long)plVar22 + 2);
        uVar36 = 2;
        plVar25 = (long *)((long)plVar22 + 3U);
        while( true ) {
          plVar37 = plVar13;
          uVar34 = (ulong)(lVar19 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar20;
          iVar35 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar29] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar35)) {
            uVar36 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar36);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar6[uVar34] = (int)plVar14 - iVar20;
            UVar10 = 1;
            local_b0 = uVar30;
            local_70 = local_b8;
            goto LAB_01bf704d;
          }
          if ((uVar27 <= uVar26) &&
             (uVar15 = (ulong)uVar26, (int)*plVar22 == *(int *)(pBVar7 + uVar15)))
          goto LAB_01bf7005;
          uVar26 = pUVar6[uVar34];
          uVar15 = (ulong)uVar26;
          uVar29 = (ulong)(*plVar37 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar14 - iVar20;
          pUVar6[uVar34] = uVar21;
          if ((uVar27 <= uVar26) && ((int)*plVar14 == *(int *)(pBVar7 + uVar15))) break;
          uVar26 = pUVar6[uVar29];
          uVar34 = uVar36;
          if (plVar38 <= (long *)((long)plVar37 + uVar36)) {
            plVar38 = plVar38 + 0x10;
            uVar34 = uVar36 + 1;
          }
          lVar19 = *plVar25;
          plVar39 = (long *)(uVar36 + (long)plVar25);
          plVar14 = plVar25;
          plVar13 = (long *)((long)plVar37 + uVar36);
          plVar22 = plVar37;
          uVar36 = uVar34;
          plVar25 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf8c58;
        }
        plVar22 = plVar14;
        plVar14 = plVar37;
        uVar34 = uVar29;
        if (uVar36 < 5) {
LAB_01bf7005:
          pUVar6[uVar34] = (int)plVar14 - iVar20;
        }
        pBVar23 = pBVar7 + uVar15;
        uVar28 = (int)plVar22 - (int)pBVar23;
        local_70 = (ulong)uVar28;
        UVar10 = uVar28 + 3;
        uVar36 = 4;
        for (; ((local_b0 = local_b8, pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_01bf704d:
        sVar12 = ZSTD_count((BYTE *)(uVar36 + (long)plVar22),pBVar23 + uVar36,pBVar2);
        uVar30 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf7093:
          seqStore->lit = seqStore->lit + uVar30;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar30) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar30) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar30);
            }
            goto LAB_01bf7093;
          }
          seqStore->lit = pBVar23 + uVar30;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar30;
        psVar24->offBase = UVar10;
        uVar30 = (sVar12 + uVar36) - 3;
        if (0xffff < uVar30) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar30;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar36);
        local_78 = plVar22;
        uVar30 = local_b0;
        local_b8 = local_70;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e44323405a9d00) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar20;
          uVar30 = 0;
          if ((uint)local_b0 != 0) {
            for (; (plVar22 <= plVar11 &&
                   ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)(uint)local_b0)));
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              uVar30 = (ulong)(uint)local_b0;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)(uint)local_b0)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar20;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              local_b0._0_4_ = (uint)local_b8;
              local_b8 = uVar30;
            }
            uVar30 = (ulong)(uint)local_b0;
            local_78 = plVar22;
          }
        }
      }
    }
    else {
      bVar16 = 0x20 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
LAB_01bf8834:
      uVar28 = (uint)local_b8;
      local_b0._0_4_ = (uint)uVar30;
      if ((long *)((long)plVar22 + 3U) < plVar11) {
        plVar38 = plVar22 + 0x10;
        uVar36 = (ulong)((uint)((int)*plVar22 * -0x61c8864f) >> (bVar16 & 0x1f));
        iVar35 = *(int *)((long)plVar22 + 1);
        uVar26 = pUVar6[uVar36];
        lVar19 = -local_b8;
        plVar14 = (long *)((long)plVar22 + 1);
        plVar13 = (long *)((long)plVar22 + 2);
        uVar30 = 2;
        plVar25 = (long *)((long)plVar22 + 3U);
        while( true ) {
          uVar34 = (ulong)uVar26;
          uVar29 = (ulong)((uint)(iVar35 * -0x61c8864f) >> (bVar16 & 0x1f));
          UVar10 = (int)plVar22 - iVar20;
          iVar35 = *(int *)((long)plVar13 + lVar19);
          pUVar6[uVar36] = UVar10;
          if ((uVar28 != 0) && ((int)*plVar13 == iVar35)) {
            uVar30 = (ulong)(*(char *)((long)plVar13 - 1) == *(char *)((long)plVar13 + lVar19 + -1))
            ;
            plVar22 = (long *)((long)plVar13 - uVar30);
            pBVar23 = (BYTE *)((long)plVar13 + (lVar19 - uVar30));
            uVar30 = uVar30 | 4;
            pUVar6[uVar29] = (int)plVar14 - iVar20;
            UVar17 = 1;
            uVar28 = (uint)local_b0;
            goto LAB_01bf89e6;
          }
          if ((uVar27 <= uVar26) && ((int)*plVar22 == *(int *)(pBVar7 + uVar34))) goto LAB_01bf899a;
          uVar26 = pUVar6[uVar29];
          uVar34 = (ulong)uVar26;
          uVar36 = (ulong)((uint)((int)*plVar13 * -0x61c8864f) >> (bVar16 & 0x1f));
          UVar10 = (int)plVar14 - iVar20;
          pUVar6[uVar29] = UVar10;
          if ((uVar27 <= uVar26) && ((int)*plVar14 == *(int *)(pBVar7 + uVar34))) break;
          uVar26 = pUVar6[uVar36];
          uVar29 = uVar30;
          if (plVar38 <= (long *)((long)plVar13 + uVar30)) {
            plVar38 = plVar38 + 0x10;
            uVar29 = uVar30 + 1;
          }
          iVar35 = (int)*plVar25;
          plVar37 = (long *)(uVar30 + (long)plVar25);
          plVar14 = plVar25;
          plVar22 = plVar13;
          plVar13 = (long *)((long)plVar13 + uVar30);
          uVar30 = uVar29;
          plVar25 = plVar37;
          if (plVar11 <= plVar37) goto LAB_01bf8c58;
        }
        plVar22 = plVar14;
        plVar14 = plVar13;
        uVar29 = uVar36;
        if (uVar30 < 5) {
LAB_01bf899a:
          pUVar6[uVar29] = (int)plVar14 - iVar20;
        }
        pBVar23 = pBVar7 + uVar34;
        uVar26 = (int)plVar22 - (int)pBVar23;
        local_b8 = (ulong)uVar26;
        UVar17 = uVar26 + 3;
        uVar30 = 4;
        for (; ((pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar30 = uVar30 + 1;
        }
LAB_01bf89e6:
        sVar12 = ZSTD_count((BYTE *)(uVar30 + (long)plVar22),pBVar23 + uVar30,pBVar2);
        uVar36 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf8a2a:
          seqStore->lit = seqStore->lit + uVar36;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar36) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar36) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar36);
            }
            goto LAB_01bf8a2a;
          }
          seqStore->lit = pBVar23 + uVar36;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar36;
        psVar24->offBase = UVar17;
        uVar36 = (sVar12 + uVar30) - 3;
        if (0xffff < uVar36) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar36;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar30);
        local_78 = plVar22;
        uVar30 = (ulong)uVar28;
        if (plVar22 <= plVar11) {
          pUVar6[(uint)(*(int *)(pBVar7 + (ulong)UVar10 + 2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               UVar10 + 2;
          pUVar6[(uint)(*(int *)((long)plVar22 + -2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               ((int)plVar22 + -2) - iVar20;
          uVar30 = 0;
          uVar36 = (ulong)uVar28;
          if (uVar28 != 0) {
            for (; uVar30 = uVar36, local_78 = plVar22, plVar22 <= plVar11;
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              lVar19 = *plVar22;
              if ((int)lVar19 != *(int *)((long)plVar22 - uVar30)) break;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),(BYTE *)((long)plVar22 + (4 - uVar30))
                                  ,pBVar2);
              pUVar6[(uint)((int)lVar19 * -0x61c8864f) >> (bVar16 & 0x1f)] = (int)plVar22 - iVar20;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              uVar36 = local_b8;
              local_b8 = uVar30;
            }
          }
        }
        goto LAB_01bf8834;
      }
    }
LAB_01bf8c58:
    if (uVar18 <= uVar31) {
      uVar18 = 0;
    }
    uVar27 = uVar18;
    if (uVar28 != 0) {
      uVar27 = uVar32;
    }
    if (uVar32 <= uVar31) {
      uVar27 = uVar18;
      uVar32 = 0;
    }
    if (uVar28 != 0) {
      uVar32 = uVar28;
    }
    *rep = uVar32;
    local_bc = (uint)local_b0;
  }
  else {
    pBVar7 = (ms->window).base;
    pBVar2 = (BYTE *)((long)src + srcSize);
    iVar35 = (int)pBVar7;
    iVar20 = (int)pBVar2 - iVar35;
    uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar27 = (ms->window).dictLimit;
    uVar32 = iVar20 - uVar31;
    if (iVar20 - uVar27 <= uVar31) {
      uVar32 = uVar27;
    }
    if (ms->loadedDictEnd != 0) {
      uVar32 = uVar27;
    }
    pBVar3 = pBVar7 + uVar32;
    plVar22 = (long *)((ulong)(pBVar3 == (BYTE *)src) + (long)src);
    iVar20 = (int)plVar22 - iVar35;
    uVar26 = iVar20 - uVar31;
    if (iVar20 - uVar27 <= uVar31) {
      uVar26 = uVar27;
    }
    if (ms->loadedDictEnd != 0) {
      uVar26 = uVar27;
    }
    uVar30 = (ulong)(uVar18 + 1);
    plVar11 = (long *)((long)src + (srcSize - 8));
    uVar18 = *rep;
    uVar31 = rep[1];
    uVar26 = iVar20 - uVar26;
    uVar27 = uVar31;
    if (uVar26 < uVar31) {
      uVar27 = 0;
    }
    uVar21 = 0;
    if (uVar18 <= uVar26) {
      uVar21 = uVar18;
    }
    local_98 = (ulong)uVar21;
    if (uVar28 == 5) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        uVar28 = (uint)local_98;
        plVar38 = (long *)((long)plVar22 + uVar30 + 1);
        local_bc = uVar27;
        if (plVar11 <= plVar38) break;
        plVar14 = plVar22 + 0x10;
        uVar29 = (ulong)(*plVar22 * -0x30e4432345000000) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar27 = pUVar6[uVar29];
        lVar33 = -local_98;
        plVar13 = (long *)((long)plVar22 + 1);
        plVar25 = (long *)(uVar30 + (long)plVar22);
        uVar36 = uVar30;
        while( true ) {
          plVar37 = plVar25;
          uVar34 = (ulong)(lVar19 * -0x30e4432345000000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar35;
          iVar20 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar29] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar20)) {
            uVar36 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar36);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar6[uVar34] = (int)plVar13 - iVar35;
            UVar10 = 1;
            local_60 = local_98;
            goto LAB_01bf7d01;
          }
          if ((uVar32 <= uVar27) &&
             (uVar15 = (ulong)uVar27, (int)*plVar22 == *(int *)(pBVar7 + uVar15)))
          goto LAB_01bf7cb9;
          uVar27 = pUVar6[uVar34];
          uVar15 = (ulong)uVar27;
          uVar29 = (ulong)(*plVar37 * -0x30e4432345000000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar13 - iVar35;
          pUVar6[uVar34] = uVar21;
          if ((uVar32 <= uVar27) && ((int)*plVar13 == *(int *)(pBVar7 + uVar15))) break;
          uVar27 = pUVar6[uVar29];
          uVar34 = uVar36;
          if (plVar14 <= (long *)((long)plVar37 + uVar36)) {
            plVar14 = plVar14 + 0x10;
            uVar34 = uVar36 + 1;
          }
          lVar19 = *plVar38;
          plVar39 = (long *)(uVar36 + (long)plVar38);
          plVar13 = plVar38;
          plVar25 = (long *)((long)plVar37 + uVar36);
          plVar22 = plVar37;
          uVar36 = uVar34;
          plVar38 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf87e7;
        }
        plVar22 = plVar13;
        plVar13 = plVar37;
        uVar34 = uVar29;
        if (uVar36 < 5) {
LAB_01bf7cb9:
          pUVar6[uVar34] = (int)plVar13 - iVar35;
        }
        pBVar23 = pBVar7 + uVar15;
        uVar27 = (int)plVar22 - (int)pBVar23;
        local_60 = (ulong)uVar27;
        UVar10 = uVar27 + 3;
        uVar36 = 4;
        for (; ((local_bc = uVar28, pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_01bf7d01:
        sVar12 = ZSTD_count((BYTE *)(uVar36 + (long)plVar22),pBVar23 + uVar36,pBVar2);
        uVar29 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf7d40:
          seqStore->lit = seqStore->lit + uVar29;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar29) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar29) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar29) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar29);
            }
            goto LAB_01bf7d40;
          }
          seqStore->lit = pBVar23 + uVar29;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar29;
        psVar24->offBase = UVar10;
        uVar29 = (sVar12 + uVar36) - 3;
        if (0xffff < uVar29) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar29;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar36);
        local_78 = plVar22;
        local_98 = local_60;
        uVar27 = local_bc;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e4432345000000) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar35;
          uVar27 = 0;
          if (local_bc != 0) {
            for (; (local_78 = plVar22, uVar27 = local_bc, plVar22 <= plVar11 &&
                   ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_bc)));
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              uVar36 = (ulong)local_bc;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)local_bc)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e4432345000000) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar35;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              local_bc = (uint)local_98;
              local_98 = uVar36;
            }
          }
        }
      }
    }
    else if (uVar28 == 6) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        uVar28 = (uint)local_98;
        plVar38 = (long *)((long)plVar22 + uVar30 + 1);
        local_bc = uVar27;
        if (plVar11 <= plVar38) break;
        plVar14 = plVar22 + 0x10;
        uVar29 = (ulong)(*plVar22 * -0x30e4432340650000) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar27 = pUVar6[uVar29];
        lVar33 = -local_98;
        plVar13 = (long *)((long)plVar22 + 1);
        plVar25 = (long *)(uVar30 + (long)plVar22);
        uVar36 = uVar30;
        while( true ) {
          plVar37 = plVar25;
          uVar34 = (ulong)(lVar19 * -0x30e4432340650000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar35;
          iVar20 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar29] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar20)) {
            uVar36 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar36);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar6[uVar34] = (int)plVar13 - iVar35;
            UVar10 = 1;
            local_60 = local_98;
            goto LAB_01bf748f;
          }
          if ((uVar32 <= uVar27) &&
             (uVar15 = (ulong)uVar27, (int)*plVar22 == *(int *)(pBVar7 + uVar15)))
          goto LAB_01bf7447;
          uVar27 = pUVar6[uVar34];
          uVar15 = (ulong)uVar27;
          uVar29 = (ulong)(*plVar37 * -0x30e4432340650000) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar13 - iVar35;
          pUVar6[uVar34] = uVar21;
          if ((uVar32 <= uVar27) && ((int)*plVar13 == *(int *)(pBVar7 + uVar15))) break;
          uVar27 = pUVar6[uVar29];
          uVar34 = uVar36;
          if (plVar14 <= (long *)((long)plVar37 + uVar36)) {
            plVar14 = plVar14 + 0x10;
            uVar34 = uVar36 + 1;
          }
          lVar19 = *plVar38;
          plVar39 = (long *)(uVar36 + (long)plVar38);
          plVar13 = plVar38;
          plVar25 = (long *)((long)plVar37 + uVar36);
          plVar22 = plVar37;
          uVar36 = uVar34;
          plVar38 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf87e7;
        }
        plVar22 = plVar13;
        plVar13 = plVar37;
        uVar34 = uVar29;
        if (uVar36 < 5) {
LAB_01bf7447:
          pUVar6[uVar34] = (int)plVar13 - iVar35;
        }
        pBVar23 = pBVar7 + uVar15;
        uVar27 = (int)plVar22 - (int)pBVar23;
        local_60 = (ulong)uVar27;
        UVar10 = uVar27 + 3;
        uVar36 = 4;
        for (; ((local_bc = uVar28, pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_01bf748f:
        sVar12 = ZSTD_count((BYTE *)(uVar36 + (long)plVar22),pBVar23 + uVar36,pBVar2);
        uVar29 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf74ce:
          seqStore->lit = seqStore->lit + uVar29;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar29) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar29) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar29) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar29);
            }
            goto LAB_01bf74ce;
          }
          seqStore->lit = pBVar23 + uVar29;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar29;
        psVar24->offBase = UVar10;
        uVar29 = (sVar12 + uVar36) - 3;
        if (0xffff < uVar29) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar29;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar36);
        local_78 = plVar22;
        local_98 = local_60;
        uVar27 = local_bc;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e4432340650000) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar35;
          uVar27 = 0;
          if (local_bc != 0) {
            for (; (local_78 = plVar22, uVar27 = local_bc, plVar22 <= plVar11 &&
                   ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_bc)));
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              uVar36 = (ulong)local_bc;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)local_bc)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e4432340650000) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar35;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              local_bc = (uint)local_98;
              local_98 = uVar36;
            }
          }
        }
      }
    }
    else if (uVar28 == 7) {
      bVar16 = 0x40 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
      while( true ) {
        local_bc = uVar27;
        uVar28 = (uint)local_98;
        plVar38 = (long *)((long)plVar22 + uVar30 + 1);
        if (plVar11 <= plVar38) break;
        plVar14 = plVar22 + 0x10;
        uVar29 = (ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
        lVar19 = *(long *)((long)plVar22 + 1);
        uVar27 = pUVar6[uVar29];
        lVar33 = -local_98;
        plVar13 = (long *)((long)plVar22 + 1);
        plVar25 = (long *)(uVar30 + (long)plVar22);
        uVar36 = uVar30;
        while( true ) {
          plVar37 = plVar25;
          uVar34 = (ulong)(lVar19 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar22 - iVar35;
          iVar20 = *(int *)((long)plVar37 + lVar33);
          pUVar6[uVar29] = uVar21;
          if ((uVar28 != 0) && ((int)*plVar37 == iVar20)) {
            uVar36 = (ulong)(*(char *)((long)plVar37 - 1) == *(char *)((long)plVar37 + lVar33 + -1))
            ;
            plVar22 = (long *)((long)plVar37 - uVar36);
            pBVar23 = (BYTE *)((long)plVar37 + (lVar33 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar6[uVar34] = (int)plVar13 - iVar35;
            UVar10 = 1;
            goto LAB_01bf6b3b;
          }
          if ((uVar32 <= uVar27) &&
             (uVar15 = (ulong)uVar27, (int)*plVar22 == *(int *)(pBVar7 + uVar15)))
          goto LAB_01bf6af3;
          uVar27 = pUVar6[uVar34];
          uVar15 = (ulong)uVar27;
          uVar29 = (ulong)(*plVar37 * -0x30e44323405a9d00) >> (bVar16 & 0x3f);
          uVar21 = (int)plVar13 - iVar35;
          pUVar6[uVar34] = uVar21;
          if ((uVar32 <= uVar27) && ((int)*plVar13 == *(int *)(pBVar7 + uVar15))) break;
          uVar27 = pUVar6[uVar29];
          uVar34 = uVar36;
          if (plVar14 <= (long *)((long)plVar37 + uVar36)) {
            plVar14 = plVar14 + 0x10;
            uVar34 = uVar36 + 1;
          }
          lVar19 = *plVar38;
          plVar39 = (long *)(uVar36 + (long)plVar38);
          plVar13 = plVar38;
          plVar25 = (long *)((long)plVar37 + uVar36);
          plVar22 = plVar37;
          uVar36 = uVar34;
          plVar38 = plVar39;
          if (plVar11 <= plVar39) goto LAB_01bf87e7;
        }
        plVar22 = plVar13;
        plVar13 = plVar37;
        uVar34 = uVar29;
        if (uVar36 < 5) {
LAB_01bf6af3:
          pUVar6[uVar34] = (int)plVar13 - iVar35;
        }
        pBVar23 = pBVar7 + uVar15;
        uVar27 = (int)plVar22 - (int)pBVar23;
        local_98 = (ulong)uVar27;
        UVar10 = uVar27 + 3;
        uVar36 = 4;
        for (; ((local_bc = uVar28, pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_01bf6b3b:
        sVar12 = ZSTD_count((BYTE *)(uVar36 + (long)plVar22),pBVar23 + uVar36,pBVar2);
        uVar29 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf6b7f:
          seqStore->lit = seqStore->lit + uVar29;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar29) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar29) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar29) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar29);
            }
            goto LAB_01bf6b7f;
          }
          seqStore->lit = pBVar23 + uVar29;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar29;
        psVar24->offBase = UVar10;
        uVar29 = (sVar12 + uVar36) - 3;
        if (0xffff < uVar29) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar29;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar36);
        local_78 = plVar22;
        uVar27 = local_bc;
        if (plVar22 <= plVar11) {
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar21 + 2) * -0x30e44323405a9d00) >>
                 (bVar16 & 0x3f)] = uVar21 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar22 + -2) * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
               ((int)plVar22 + -2) - iVar35;
          uVar27 = 0;
          if (local_bc != 0) {
            for (; (local_78 = plVar22, uVar27 = local_bc, plVar22 <= plVar11 &&
                   ((int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_bc)));
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              uVar36 = (ulong)local_bc;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)local_bc)),pBVar2);
              pUVar6[(ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar16 & 0x3f)] =
                   (int)plVar22 - iVar35;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              local_bc = (uint)local_98;
              local_98 = uVar36;
            }
          }
        }
      }
    }
    else {
      bVar16 = 0x20 - cVar9;
      plVar1 = (long *)(pBVar2 + -0x20);
LAB_01bf83ca:
      uVar28 = (uint)local_98;
      plVar38 = (long *)((long)plVar22 + uVar30 + 1);
      local_bc = uVar27;
      if (plVar38 < plVar11) {
        plVar14 = plVar22 + 0x10;
        uVar29 = (ulong)((uint)((int)*plVar22 * -0x61c8864f) >> (bVar16 & 0x1f));
        iVar20 = *(int *)((long)plVar22 + 1);
        uVar21 = pUVar6[uVar29];
        lVar19 = -local_98;
        plVar13 = (long *)((long)plVar22 + 1);
        plVar25 = (long *)(uVar30 + (long)plVar22);
        uVar36 = uVar30;
        while( true ) {
          uVar15 = (ulong)uVar21;
          uVar34 = (ulong)((uint)(iVar20 * -0x61c8864f) >> (bVar16 & 0x1f));
          UVar10 = (int)plVar22 - iVar35;
          iVar20 = *(int *)((long)plVar25 + lVar19);
          pUVar6[uVar29] = UVar10;
          if ((uVar28 != 0) && ((int)*plVar25 == iVar20)) {
            uVar36 = (ulong)(*(char *)((long)plVar25 - 1) == *(char *)((long)plVar25 + lVar19 + -1))
            ;
            plVar22 = (long *)((long)plVar25 - uVar36);
            pBVar23 = (BYTE *)((long)plVar25 + (lVar19 - uVar36));
            uVar36 = uVar36 | 4;
            pUVar6[uVar34] = (int)plVar13 - iVar35;
            local_bc = 1;
            uVar28 = uVar27;
            goto LAB_01bf8587;
          }
          if ((uVar32 <= uVar21) && ((int)*plVar22 == *(int *)(pBVar7 + uVar15))) goto LAB_01bf853c;
          uVar21 = pUVar6[uVar34];
          uVar15 = (ulong)uVar21;
          uVar29 = (ulong)((uint)((int)*plVar25 * -0x61c8864f) >> (bVar16 & 0x1f));
          UVar10 = (int)plVar13 - iVar35;
          pUVar6[uVar34] = UVar10;
          if ((uVar32 <= uVar21) && ((int)*plVar13 == *(int *)(pBVar7 + uVar15))) break;
          uVar21 = pUVar6[uVar29];
          uVar34 = uVar36;
          if (plVar14 <= (long *)((long)plVar25 + uVar36)) {
            plVar14 = plVar14 + 0x10;
            uVar34 = uVar36 + 1;
          }
          iVar20 = (int)*plVar38;
          plVar37 = (long *)(uVar36 + (long)plVar38);
          plVar13 = plVar38;
          plVar22 = plVar25;
          plVar25 = (long *)((long)plVar25 + uVar36);
          uVar36 = uVar34;
          plVar38 = plVar37;
          if (plVar11 <= plVar37) goto LAB_01bf87e7;
        }
        plVar22 = plVar13;
        plVar13 = plVar25;
        uVar34 = uVar29;
        if (uVar36 < 5) {
LAB_01bf853c:
          pUVar6[uVar34] = (int)plVar13 - iVar35;
        }
        pBVar23 = pBVar7 + uVar15;
        local_bc = (int)plVar22 - (int)pBVar23;
        local_98 = (ulong)local_bc;
        local_bc = local_bc + 3;
        uVar36 = 4;
        for (; ((pBVar3 < pBVar23 && (local_78 < plVar22)) &&
               (*(BYTE *)((long)plVar22 + -1) == pBVar23[-1]));
            plVar22 = (long *)((long)plVar22 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar36 = uVar36 + 1;
        }
LAB_01bf8587:
        sVar12 = ZSTD_count((BYTE *)(uVar36 + (long)plVar22),pBVar23 + uVar36,pBVar2);
        uVar29 = (long)plVar22 - (long)local_78;
        plVar38 = (long *)seqStore->lit;
        if (plVar1 < plVar22) {
          ZSTD_safecopyLiterals((BYTE *)plVar38,(BYTE *)local_78,(BYTE *)plVar22,(BYTE *)plVar1);
LAB_01bf85c6:
          seqStore->lit = seqStore->lit + uVar29;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar29) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar19 = local_78[1];
          *plVar38 = *local_78;
          plVar38[1] = lVar19;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar29) {
            lVar19 = local_78[3];
            *(long *)(pBVar23 + 0x10) = local_78[2];
            *(long *)(pBVar23 + 0x18) = lVar19;
            if (0x20 < (long)uVar29) {
              lVar19 = 0;
              do {
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
                uVar8 = puVar5[1];
                pBVar4 = pBVar23 + lVar19 + 0x20;
                *(undefined8 *)pBVar4 = *puVar5;
                *(undefined8 *)(pBVar4 + 8) = uVar8;
                puVar5 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
                uVar8 = puVar5[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
                *(undefined8 *)(pBVar4 + 0x18) = uVar8;
                lVar19 = lVar19 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar29);
            }
            goto LAB_01bf85c6;
          }
          seqStore->lit = pBVar23 + uVar29;
          psVar24 = seqStore->sequences;
        }
        psVar24->litLength = (U16)uVar29;
        psVar24->offBase = local_bc;
        uVar29 = (sVar12 + uVar36) - 3;
        if (0xffff < uVar29) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->mlBase = (U16)uVar29;
        seqStore->sequences = psVar24 + 1;
        plVar22 = (long *)((long)plVar22 + sVar12 + uVar36);
        local_78 = plVar22;
        uVar27 = uVar28;
        if (plVar22 <= plVar11) {
          pUVar6[(uint)(*(int *)(pBVar7 + (ulong)UVar10 + 2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               UVar10 + 2;
          pUVar6[(uint)(*(int *)((long)plVar22 + -2) * -0x61c8864f) >> (bVar16 & 0x1f)] =
               ((int)plVar22 + -2) - iVar35;
          uVar27 = 0;
          if (uVar28 != 0) {
            for (; local_78 = plVar22, uVar27 = uVar28, plVar22 <= plVar11;
                plVar22 = (long *)((long)plVar22 + sVar12 + 4)) {
              lVar19 = *plVar22;
              if ((int)lVar19 != *(int *)((long)plVar22 - (ulong)uVar28)) break;
              uVar27 = (uint)local_98;
              local_98 = (ulong)uVar28;
              sVar12 = ZSTD_count((BYTE *)((long)plVar22 + 4),
                                  (BYTE *)((long)plVar22 + (4 - (ulong)uVar28)),pBVar2);
              pUVar6[(uint)((int)lVar19 * -0x61c8864f) >> (bVar16 & 0x1f)] = (int)plVar22 - iVar35;
              plVar38 = (long *)seqStore->lit;
              if (plVar1 < plVar22) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar38,(BYTE *)plVar22,(BYTE *)plVar22,(BYTE *)plVar1);
              }
              else {
                lVar19 = plVar22[1];
                *plVar38 = *plVar22;
                plVar38[1] = lVar19;
              }
              psVar24 = seqStore->sequences;
              psVar24->litLength = 0;
              psVar24->offBase = 1;
              if (0xffff < sVar12 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar24->mlBase = (U16)(sVar12 + 1);
              seqStore->sequences = psVar24 + 1;
              uVar28 = uVar27;
            }
          }
        }
        goto LAB_01bf83ca;
      }
    }
LAB_01bf87e7:
    if (uVar31 <= uVar26) {
      uVar31 = 0;
    }
    uVar27 = uVar31;
    if (uVar28 != 0) {
      uVar27 = uVar18;
    }
    if (uVar18 <= uVar26) {
      uVar27 = uVar31;
      uVar18 = 0;
    }
    if (uVar28 != 0) {
      uVar18 = uVar28;
    }
    *rep = uVar18;
  }
  if (local_bc != 0) {
    uVar27 = local_bc;
  }
  rep[1] = uVar27;
  return (long)src + (srcSize - (long)local_78);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}